

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<JsUtil::Pair<unsigned_int,int,DefaultComparer>>
          (BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,Pair<unsigned_int,_int,_DefaultComparer> *key,PropertySym **value)

{
  long lVar1;
  hash_t hVar2;
  ulong uVar3;
  DictionaryStats *this_00;
  uint uVar4;
  uint depth;
  
  lVar1 = *(long *)this;
  depth = 0;
  if (lVar1 != 0) {
    hVar2 = PrimePolicy::ModPrime
                      (key->second + key->first & 0x7fffffff,*(uint *)(this + 0x1c),
                       *(int *)(this + 0x2c));
    uVar4 = *(uint *)(lVar1 + (ulong)hVar2 * 4);
    depth = 0;
    if (-1 < (int)uVar4) {
      lVar1 = *(long *)(this + 8);
      depth = 0;
      do {
        uVar3 = (ulong)uVar4;
        if ((*(uint *)(lVar1 + 0xc + uVar3 * 0x18) == key->first) &&
           (*(int *)(lVar1 + 0x10 + uVar3 * 0x18) == key->second)) {
          this_00 = *(DictionaryStats **)(this + 0x30);
          goto LAB_0063657b;
        }
        depth = depth + 1;
        uVar4 = *(uint *)(lVar1 + uVar3 * 0x18 + 8);
      } while (-1 < (int)uVar4);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar4 = 0xffffffff;
LAB_0063657b:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  if (-1 < (int)uVar4) {
    *value = *(PropertySym **)(*(long *)(this + 8) + (ulong)uVar4 * 0x18);
  }
  return -1 < (int)uVar4;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }